

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> * __thiscall
cfd::core::Psbt::GetTxOutRecordKeyList
          (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__return_storage_ptr__
          ,Psbt *this,uint32_t index)

{
  ByteData local_60;
  undefined8 *local_48;
  wally_map_item *item;
  size_t idx;
  wally_psbt_output *output;
  void *local_28;
  wally_psbt *psbt_pointer;
  Psbt *pPStack_18;
  uint32_t index_local;
  Psbt *this_local;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *result;
  
  psbt_pointer._4_4_ = index;
  pPStack_18 = this;
  this_local = (Psbt *)__return_storage_ptr__;
  (*this->_vptr_Psbt[3])(this,(ulong)index,0xc3f,"GetTxOutRecordKeyList");
  local_28 = this->wally_psbt_pointer_;
  output._7_1_ = 0;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (__return_storage_ptr__);
  idx = *(long *)((long)local_28 + 0x28) + (ulong)psbt_pointer._4_4_ * 0xd0;
  for (item = (wally_map_item *)0x0; item < *(wally_map_item **)(idx + 0x40);
      item = (wally_map_item *)((long)&item->key + 1)) {
    local_48 = (undefined8 *)(*(long *)(idx + 0x38) + (long)item * 0x20);
    ByteData::ByteData(&local_60,(uint8_t *)*local_48,*(uint32_t *)(local_48 + 1));
    ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
    emplace_back<cfd::core::ByteData>(__return_storage_ptr__,&local_60);
    ByteData::~ByteData(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ByteData> Psbt::GetTxOutRecordKeyList(uint32_t index) const {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  std::vector<ByteData> result;
  auto output = &psbt_pointer->outputs[index];
  for (size_t idx = 0; idx < output->unknowns.num_items; ++idx) {
    auto item = &output->unknowns.items[idx];
    result.emplace_back(
        ByteData(item->key, static_cast<uint32_t>(item->key_len)));
  }
  return result;
}